

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeMipmapTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeMipmapTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *this_01;
  CoordType CVar1;
  int y;
  int width;
  int height;
  TestLog *pTVar2;
  float fVar3;
  TextureCubeMipmapTestInstance *pTVar4;
  TestStatus *__return_storage_ptr___00;
  deUint32 dVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  TextureFormat format;
  ulong uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer __n;
  Surface *pSVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  allocator<char> local_4b3;
  allocator<char> local_4b2;
  allocator<char> local_4b1;
  float local_4b0;
  CoordType local_4ac;
  ulong local_4a8;
  TextureCubeMipmapTestInstance *local_4a0;
  deUint32 local_498;
  deUint32 local_494;
  float local_490;
  float local_48c;
  PixelFormat local_488;
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrec;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  ConstPixelBufferAccess local_428;
  PixelBufferAccess local_400;
  TestStatus *local_3d8;
  PixelBufferAccess local_3d0;
  PixelBufferAccess local_3a8;
  Surface referenceFrame;
  Surface renderedFrame;
  Surface errorMask;
  TextureFormat local_338;
  WrapMode local_330;
  int local_32c [3];
  TextureFormat local_320;
  ConstPixelBufferAccess *pCStack_318;
  BVec4 local_310;
  undefined1 local_30c [76];
  ConstPixelBufferAccess *pCStack_2c0;
  ConstPixelBufferAccess *local_2b8;
  ConstPixelBufferAccess *pCStack_2b0;
  int local_2a8;
  bool local_294;
  undefined7 uStack_293;
  LodMode local_28c;
  IVec4 formatBitDepth;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  int local_248;
  undefined1 auStack_244 [348];
  SurfaceAccess idealDst;
  PixelBufferAccess local_58;
  long lVar10;
  
  this_00 = &this->m_renderer;
  dVar5 = util::TextureRenderer::getRenderWidth(this_00);
  dVar6 = util::TextureRenderer::getRenderHeight(this_00);
  CVar1 = (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_30c,TEXTURETYPE_CUBE);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,dVar5,dVar6);
  util::createSampler((Sampler *)local_268,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  local_2a8 = local_248;
  local_2b8 = (ConstPixelBufferAccess *)local_258._M_allocated_capacity;
  pCStack_2b0 = (ConstPixelBufferAccess *)local_258._8_8_;
  local_30c._68_8_ = local_268._0_8_;
  pCStack_2c0 = (ConstPixelBufferAccess *)local_268._8_8_;
  format = ::vk::mapVkFormat((this->m_testParameters).super_TextureCubeTestCaseParameters.
                             super_TextureCommonTestCaseParameters.format);
  local_30c._4_4_ = glu::TextureTestUtil::getSamplerType(format);
  local_30c._8_4_ = (uint)(CVar1 == COORDTYPE_PROJECTED) + (uint)(CVar1 == COORDTYPE_BASIC_BIAS) * 2
  ;
  local_28c = LODMODE_EXACT;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  computeGridLayout(&gridLayout,dVar5,dVar6);
  local_4ac = CVar1;
  local_4a0 = this;
  local_498 = dVar6;
  local_494 = dVar5;
  local_3d8 = __return_storage_ptr__;
  if (texture::(anonymous_namespace)::TextureCubeMipmapTestInstance::iterate()::s_projections ==
      '\0') {
    iVar8 = __cxa_guard_acquire(&texture::(anonymous_namespace)::TextureCubeMipmapTestInstance::
                                 iterate()::s_projections);
    if (iVar8 != 0) {
      iterate::s_projections[0].m_data[0] = _DAT_009f0c20;
      iterate::s_projections[0].m_data[1] = _UNK_009f0c24;
      iterate::s_projections[0].m_data[2] = _UNK_009f0c28;
      iterate::s_projections[0].m_data[3] = _UNK_009f0c2c;
      iterate::s_projections[1].m_data[0] = _DAT_009f0d70;
      iterate::s_projections[1].m_data[1] = _UNK_009f0d74;
      iterate::s_projections[1].m_data[2] = _UNK_009f0d78;
      iterate::s_projections[1].m_data[3] = _UNK_009f0d7c;
      iterate::s_projections[2].m_data[0] = _DAT_009f0d80;
      iterate::s_projections[2].m_data[1] = _UNK_009f0d84;
      iterate::s_projections[2].m_data[2] = _UNK_009f0d88;
      iterate::s_projections[2].m_data[3] = _UNK_009f0d8c;
      iterate::s_projections[3].m_data[0] = _DAT_009f0d90;
      iterate::s_projections[3].m_data[1] = _UNK_009f0d94;
      iterate::s_projections[3].m_data[2] = _UNK_009f0d98;
      iterate::s_projections[3].m_data[3] = _UNK_009f0d9c;
      __cxa_guard_release(&texture::(anonymous_namespace)::TextureCubeMipmapTestInstance::iterate()
                           ::s_projections);
    }
  }
  lVar14 = 0xc;
  uVar13 = 0;
  while( true ) {
    uVar12 = (uint)uVar13;
    if ((long)(int)((ulong)((long)gridLayout.
                                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)gridLayout.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (long)uVar13)
    break;
    local_4a8 = CONCAT44(local_4a8._4_4_,
                         (float)*(int *)((long)(gridLayout.
                                                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                        lVar14 + -0xc));
    local_4b0 = (float)*(int *)((long)(gridLayout.
                                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_data +
                               lVar14 + -8);
    local_48c = (float)*(int *)((long)(gridLayout.
                                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_data +
                               lVar14 + -4);
    local_490 = (float)*(int *)((long)(gridLayout.
                                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14);
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,(int)((uVar13 & 0xffffffff) / 6) * -6 + uVar12);
    if (local_4ac == COORDTYPE_PROJECTED) {
      local_30c._8_4_ = local_30c._8_4_ | 1;
      uVar9 = (ulong)((uVar12 & 3) << 4);
      local_30c._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar9);
      local_30c._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar9 + 8);
    }
    else if (local_4ac == COORDTYPE_BASIC_BIAS) {
      local_30c._8_4_ = local_30c._8_4_ | 2;
      local_30c._28_4_ = Texture2DMipmapTestInstance::iterate::s_bias[uVar12 & 7];
    }
    util::TextureRenderer::setViewport(this_00,(float)local_4a8,local_4b0,local_48c,local_490);
    util::TextureRenderer::renderQuad
              (this_00,&renderedFrame,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_30c);
    uVar13 = uVar13 + 1;
    lVar14 = lVar14 + 0x10;
  }
  local_268._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_268);
  dVar6 = local_494;
  dVar5 = local_498;
  local_488.redBits = formatBitDepth.m_data[0];
  local_488.greenBits = formatBitDepth.m_data[1];
  local_488.blueBits = formatBitDepth.m_data[2];
  local_488.alphaBits = formatBitDepth.m_data[3];
  tcu::Surface::Surface(&referenceFrame,local_494,local_498);
  pTVar4 = local_4a0;
  CVar1 = local_4ac;
  tcu::Surface::Surface(&errorMask,dVar6,dVar5);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&local_338);
  lodPrec.rule = RULE_VULKAN;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  util::createSampler((Sampler *)local_268,
                      (pTVar4->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (pTVar4->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (pTVar4->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (pTVar4->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  local_2a8 = local_248;
  local_2b8 = (ConstPixelBufferAccess *)local_258._M_allocated_capacity;
  pCStack_2b0 = (ConstPixelBufferAccess *)local_258._8_8_;
  local_30c._68_8_ = local_268._0_8_;
  pCStack_2c0 = (ConstPixelBufferAccess *)local_268._8_8_;
  uStack_293 = (undefined7)(CONCAT44(auStack_244._20_4_,auStack_244._16_4_) >> 8);
  local_294 = true;
  local_28c = LODMODE_EXACT;
  local_310.m_data[1] = 0 < local_488.greenBits;
  local_310.m_data[0] = 0 < local_488.redBits;
  local_310.m_data[2] = 0 < local_488.blueBits;
  local_310.m_data[3] = 0 < local_488.alphaBits;
  local_428.m_format.order = local_488.redBits;
  local_428.m_format.type = local_488.greenBits;
  local_428.m_size.m_data[0] = local_488.blueBits;
  local_428.m_size.m_data[1] = local_488.alphaBits;
  tcu::operator-((tcu *)&local_400,(Vector<int,_4> *)&local_428,2);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_3a8,0);
  tcu::max<int,4>((tcu *)&idealDst,(Vector<int,_4> *)&local_400,(Vector<int,_4> *)&local_3a8);
  tcu::computeFixedPointThreshold((tcu *)local_268,(IVec4 *)&idealDst);
  bVar15 = CVar1 != COORDTYPE_PROJECTED;
  local_320.order = local_268._0_4_;
  local_320.type = local_268._4_4_;
  pCStack_318 = (ConstPixelBufferAccess *)local_268._8_8_;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_268,bVar15 + 8 + (uint)bVar15);
  local_330 = local_268._8_4_;
  local_338.order = local_268._0_4_;
  local_338.type = local_268._4_4_;
  local_32c[0] = 5;
  local_32c[1] = 5;
  local_32c[2] = 0;
  lodPrec.derivateBits = 10;
  uVar13 = 0;
  lVar14 = 0xc;
  local_4b0 = 0.0;
  lodPrec.lodBits = (uint)bVar15 * 3 + 3;
  while( true ) {
    __return_storage_ptr___00 = local_3d8;
    pTVar4 = local_4a0;
    fVar3 = local_4b0;
    if ((long)(int)((ulong)((long)gridLayout.
                                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)gridLayout.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (long)uVar13)
    break;
    iVar8 = *(int *)((long)(gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + -0xc);
    y = *(int *)((long)(gridLayout.
                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + -8);
    width = *(int *)((long)(gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + -4);
    height = *(int *)((long)(gridLayout.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14);
    local_4a8 = uVar13;
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,(int)((uVar13 & 0xffffffff) / 6) * -6 + (int)uVar13);
    if (local_4ac == COORDTYPE_PROJECTED) {
      local_30c._8_4_ = local_30c._8_4_ | 1;
      uVar13 = (ulong)(((uint)local_4a8 & 3) << 4);
      local_30c._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar13);
      local_30c._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar13 + 8);
    }
    else if (local_4ac == COORDTYPE_BASIC_BIAS) {
      local_30c._8_4_ = local_30c._8_4_ | 2;
      local_30c._28_4_ = Texture2DMipmapTestInstance::iterate::s_bias[(uint)local_4a8 & 7];
    }
    tcu::SurfaceAccess::SurfaceAccess(&idealDst,&referenceFrame,&local_488,iVar8,y,width,height);
    iVar7 = (*(((local_4a0->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
    lVar10 = CONCAT44(extraout_var,iVar7);
    auStack_244._12_4_ = (undefined4)*(undefined8 *)(lVar10 + 0x160);
    auStack_244._16_4_ = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x160) >> 0x20);
    local_268._0_8_ = *(TextureFormat *)(lVar10 + 0x130);
    local_268._8_8_ = *(undefined8 *)(lVar10 + 0x138);
    local_258._M_allocated_capacity = *(undefined8 *)(lVar10 + 0x140);
    local_258._8_8_ = *(undefined8 *)(lVar10 + 0x148);
    local_248 = (int)*(undefined8 *)(lVar10 + 0x150);
    auStack_244._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x150) >> 0x20);
    auStack_244._4_4_ = (undefined4)*(undefined8 *)(lVar10 + 0x158);
    auStack_244._8_4_ = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x158) >> 0x20);
    glu::TextureTestUtil::sampleTexture
              (&idealDst,(TextureCubeView *)local_268,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_30c);
    tcu::Surface::getAccess(&local_400,&renderedFrame);
    tcu::getSubregion((PixelBufferAccess *)&idealDst,&local_400,iVar8,y,width,height);
    tcu::Surface::getAccess(&local_3a8,&referenceFrame);
    tcu::getSubregion((PixelBufferAccess *)&local_428,&local_3a8,iVar8,y,width,height);
    tcu::Surface::getAccess(&local_58,&errorMask);
    tcu::getSubregion(&local_3d0,&local_58,iVar8,y,width,height);
    pTVar4 = local_4a0;
    iVar8 = (*(((local_4a0->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
    lVar10 = CONCAT44(extraout_var_00,iVar8);
    auStack_244._12_4_ = (undefined4)*(undefined8 *)(lVar10 + 0x160);
    auStack_244._16_4_ = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x160) >> 0x20);
    local_268._0_8_ = *(TextureFormat *)(lVar10 + 0x130);
    local_268._8_8_ = *(undefined8 *)(lVar10 + 0x138);
    local_258._M_allocated_capacity = *(undefined8 *)(lVar10 + 0x140);
    local_258._8_8_ = *(undefined8 *)(lVar10 + 0x148);
    local_248 = (int)*(undefined8 *)(lVar10 + 0x150);
    auStack_244._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x150) >> 0x20);
    auStack_244._4_4_ = (undefined4)*(undefined8 *)(lVar10 + 0x158);
    auStack_244._8_4_ = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x158) >> 0x20);
    iVar8 = glu::TextureTestUtil::computeTextureLookupDiff
                      ((ConstPixelBufferAccess *)&idealDst,&local_428,&local_3d0,
                       (TextureCubeView *)local_268,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_30c,
                       (LookupPrecision *)&local_338,&lodPrec,
                       ((pTVar4->super_TestInstance).m_context)->m_testCtx->m_watchDog);
    local_4b0 = (float)((int)local_4b0 + iVar8);
    uVar13 = local_4a8 + 1;
    lVar14 = lVar14 + 0x10;
  }
  __n = gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)local_4b0) {
    local_268._0_8_ = ((local_4a0->super_TestInstance).m_context)->m_testCtx->m_log;
    this_01 = (ostringstream *)(local_268 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::operator<<((ostream *)this_01,"ERROR: Image verification failed, found ");
    std::ostream::operator<<(this_01,(int)fVar3);
    std::operator<<((ostream *)this_01," invalid pixels!");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
  }
  pTVar2 = ((pTVar4->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"Result",(allocator<char> *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"Verification result",&local_4b1);
  tcu::LogImageSet::LogImageSet((LogImageSet *)&idealDst,(string *)&local_400,(string *)&local_428);
  iVar8 = (int)pTVar2;
  tcu::LogImageSet::write((LogImageSet *)&idealDst,iVar8,__buf,(size_t)__n);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"Rendered",&local_4b2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"Rendered image",&local_4b3);
  pSVar11 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)local_268,(string *)&local_3a8,(string *)&local_3d0,pSVar11,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_268,iVar8,__buf_00,(size_t)pSVar11);
  tcu::LogImage::~LogImage((LogImage *)local_268);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3a8);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&idealDst);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_400);
  if (0 < (int)fVar3) {
    pTVar2 = ((pTVar4->super_TestInstance).m_context)->m_testCtx->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"Reference",(allocator<char> *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,"Ideal reference",&local_4b1);
    pSVar11 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)local_268,(string *)&local_400,(string *)&local_428,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar8 = (int)pTVar2;
    tcu::LogImage::write((LogImage *)local_268,iVar8,__buf_01,(size_t)pSVar11);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"ErrorMask",&local_4b2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"Error mask",&local_4b3)
    ;
    pSVar11 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&idealDst,(string *)&local_3a8,(string *)&local_3d0,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&idealDst,iVar8,__buf_02,(size_t)pSVar11);
    tcu::LogImage::~LogImage((LogImage *)&idealDst);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3a8);
    tcu::LogImage::~LogImage((LogImage *)local_268);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_400);
  }
  tcu::TestLog::endImageSet(((pTVar4->super_TestInstance).m_context)->m_testCtx->m_log);
  if (fVar3 == 0.0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_268,"pass",(allocator<char> *)&idealDst);
    tcu::TestStatus::pass(__return_storage_ptr___00,(string *)local_268);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_268,"fail",(allocator<char> *)&idealDst);
    tcu::TestStatus::fail(__return_storage_ptr___00,(string *)local_268);
  }
  std::__cxx11::string::~string((string *)local_268);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&gridLayout.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
  tcu::Surface::~Surface(&renderedFrame);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus TextureCubeMipmapTestInstance::iterate (void)
{
	const int			viewportWidth	= m_renderer.getRenderWidth();
	const int			viewportHeight	= m_renderer.getRenderHeight();

	const bool			isProjected		= m_testParameters.coordType == COORDTYPE_PROJECTED;
	const bool			useLodBias		= m_testParameters.coordType == COORDTYPE_BASIC_BIAS;

	ReferenceParams		refParams		(TEXTURETYPE_CUBE);
	vector<float>		texCoord;
	tcu::Surface		renderedFrame	(viewportWidth, viewportHeight);

	refParams.sampler		= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	refParams.samplerType	= getSamplerType(vk::mapVkFormat(m_testParameters.format));
	refParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);
	refParams.lodMode		= LODMODE_EXACT; // Use ideal lod.

	// Compute grid.
	vector<IVec4> gridLayout;
	computeGridLayout(gridLayout, viewportWidth, viewportHeight);

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values \note Less agressive than in 2D case due to smaller quads.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 1.1f),
		Vec4(0.8f, 1.0f, 1.2f, 0.8f),
		Vec4(1.2f, 1.0f, 1.3f, 0.9f)
	};

	// Render with GL
	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		const float			curX		= (float)gridLayout[cellNdx].x();
		const float			curY		= (float)gridLayout[cellNdx].y();
		const float			curW		= (float)gridLayout[cellNdx].z();
		const float			curH		= (float)gridLayout[cellNdx].w();
		const tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

		DE_ASSERT(m_testParameters.coordType != COORDTYPE_AFFINE); // Not supported.
		computeQuadTexCoordCube(texCoord, cubeFace);

		if (isProjected)
		{
			refParams.flags	|= ReferenceParams::PROJECTED;
			refParams.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
		}

		if (useLodBias)
		{
			refParams.flags	|= ReferenceParams::USE_BIAS;
			refParams.bias	 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
		}

		// Render
		m_renderer.setViewport(curX, curY, curW, curH);
		m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
	}

	// Render reference and compare
	{
		const tcu::IVec4		formatBitDepth		= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat			(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		tcu::Surface			referenceFrame		(viewportWidth, viewportHeight);
		tcu::Surface			errorMask			(viewportWidth, viewportHeight);
		int						numFailedPixels		= 0;
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec				(tcu::LodPrecision::RULE_VULKAN);

		// Params for rendering reference
		refParams.sampler					= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
		refParams.sampler.seamlessCubeMap	= true;
		refParams.lodMode					= LODMODE_EXACT;

		// Comparison parameters
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat)-2, tcu::IVec4(0)));
		lookupPrec.coordBits		= isProjected ? tcu::IVec3(8) : tcu::IVec3(10);
		lookupPrec.uvwBits			= tcu::IVec3(5,5,0);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 3 : 6;

		for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
		{
			const int				curX		= gridLayout[cellNdx].x();
			const int				curY		= gridLayout[cellNdx].y();
			const int				curW		= gridLayout[cellNdx].z();
			const int				curH		= gridLayout[cellNdx].w();
			const tcu::CubeFace		cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

			DE_ASSERT(m_testParameters.coordType != COORDTYPE_AFFINE); // Not supported.
			computeQuadTexCoordCube(texCoord, cubeFace);

			if (isProjected)
			{
				refParams.flags	|= ReferenceParams::PROJECTED;
				refParams.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
			}

			if (useLodBias)
			{
				refParams.flags	|= ReferenceParams::USE_BIAS;
				refParams.bias	 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
			}

			// Render ideal reference.
			{
				tcu::SurfaceAccess idealDst(referenceFrame, pixelFormat, curX, curY, curW, curH);
				sampleTexture(idealDst, m_texture->getTexture(), &texCoord[0], refParams);
			}

			// Compare this cell
			numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
														m_texture->getTexture(), &texCoord[0], refParams,
														lookupPrec, lodPrec, m_context.getTestContext().getWatchDog());
		}

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;
		}

		m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}